

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

int __thiscall QCache<QString,_QIcon>::unlink(QCache<QString,_QIcon> *this,char *__name)

{
  long lVar1;
  long *plVar2;
  int extraout_EAX;
  size_t hash;
  QStringView QVar3;
  Bucket bucket;
  
  lVar1 = *(long *)__name;
  plVar2 = *(long **)(__name + 8);
  *(long **)(lVar1 + 8) = plVar2;
  *plVar2 = lVar1;
  this->total = this->total - *(long *)(__name + 0x30);
  QVar3.m_data = *(storage_type_conflict **)(__name + 0x18);
  QVar3.m_size = *(qsizetype *)(__name + 0x20);
  hash = qHash(QVar3,(this->d).seed);
  bucket = QHashPrivate::Data<QCache<QString,_QIcon>::Node>::findBucketWithHash<QString>
                     (&this->d,(QString *)(__name + 0x10),hash);
  QHashPrivate::Data<QCache<QString,_QIcon>::Node>::erase(&this->d,bucket);
  return extraout_EAX;
}

Assistant:

void unlink(Node *n) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        Q_ASSERT(n->prev);
        Q_ASSERT(n->next);
        n->prev->next = n->next;
        n->next->prev = n->prev;
        total -= n->value.cost;
        auto it = d.findBucket(n->key);
        d.erase(it);
    }